

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

void nng_http_handler_set_data(nng_http_handler *h,void *dat,_func_void_void_ptr *dtor)

{
  _func_void_void_ptr *dtor_local;
  void *dat_local;
  nng_http_handler *h_local;
  
  nni_http_handler_set_data(h,dat,dtor);
  return;
}

Assistant:

void
nng_http_handler_set_data(nng_http_handler *h, void *dat, void (*dtor)(void *))
{
#ifdef NNG_SUPP_HTTP
	nni_http_handler_set_data(h, dat, dtor);
#else
	NNI_ARG_UNUSED(h);
	NNI_ARG_UNUSED(dat);
	NNI_ARG_UNUSED(dtor);
#endif
}